

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O3

void __thiscall PKCS12Test_CreateWithAlias_Test::TestBody(PKCS12Test_CreateWithAlias_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  X509 *x;
  EVP_PKEY_ASN1_METHOD *pEVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var5;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar6;
  char *in_R9;
  pointer *__ptr;
  initializer_list<x509_st_*> __l;
  UniquePtr<PKCS12> p12;
  EVP_PKEY *parsed_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> der;
  vector<x509_st_*,_std::allocator<x509_st_*>_> certs;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  UniquePtr<BIO> bio;
  string alias;
  X509 *parsed_cert;
  UniquePtr<X509> cert1;
  int alias_len;
  UniquePtr<X509> cert2;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  stack_st_X509 *ca_certs;
  int res;
  undefined1 local_110 [8];
  EVP_PKEY_ASN1_METHOD *local_108;
  undefined1 local_100 [8];
  EVP_PKEY_ASN1_METHOD *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  AssertHelper local_e0;
  __uniq_ptr_impl<pkcs12_st,_bssl::internal::Deleter> local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_b0;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AssertHelper local_60;
  undefined1 local_58 [24];
  _Head_base<0UL,_evp_pkey_st_*,_false> local_40;
  AssertHelper local_38;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_30;
  _Head_base<0UL,_stack_st_X509_*,_false> local_28;
  int local_1c;
  
  MakeTestKey();
  local_100[0] = (internal)(local_40._M_head_impl != (EVP_PKEY *)0x0);
  local_f8 = (EVP_PKEY_ASN1_METHOD *)0x0;
  if (local_40._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_100,(AssertionResult *)0x5e57b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x260,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.
                                     super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_b0.
                                     super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    }
    goto LAB_00349783;
  }
  MakeTestCert((EVP_PKEY *)local_58);
  local_100[0] = (internal)
                 ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_58._0_8_ !=
                 (x509_st *)0x0);
  local_f8 = (EVP_PKEY_ASN1_METHOD *)0x0;
  if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_58._0_8_ == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_100,(AssertionResult *)"cert1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x262,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.
                                     super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_b0.
                                     super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
    if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    }
  }
  else {
    MakeTestCert((EVP_PKEY *)(local_58 + 0x10));
    local_100[0] = (internal)
                   ((EVP_PKEY_ASN1_METHOD *)local_58._16_8_ != (EVP_PKEY_ASN1_METHOD *)0x0);
    local_f8 = (EVP_PKEY_ASN1_METHOD *)0x0;
    if ((EVP_PKEY_ASN1_METHOD *)local_58._16_8_ == (EVP_PKEY_ASN1_METHOD *)0x0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_80,(internal *)local_100,(AssertionResult *)"cert2","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x264,local_80._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_b0.
                                       super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_b0.
                                       super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
      if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      }
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"I\'m an alias","");
      local_1c = X509_alias_set1((X509 *)local_58._0_8_,(uchar *)local_80._M_dataplus._M_p,
                                 (int)local_80._M_string_length);
      local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_100,"res","1",&local_1c,(int *)&local_b0);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b0);
        if (local_f8 == (EVP_PKEY_ASN1_METHOD *)0x0) {
          message = "";
        }
        else {
          message = ((_Alloc_hider *)&local_f8->pkey_id)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x26a,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
        if ((long *)CONCAT44(local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b0.
                                         super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_b0.
                                         super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
        }
        if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        }
      }
      else {
        if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        }
        local_100 = (undefined1  [8])local_58._0_8_;
        local_f8 = (EVP_PKEY_ASN1_METHOD *)local_58._16_8_;
        __l._M_len = 2;
        __l._M_array = (iterator)local_100;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  (&local_b0,__l,(allocator_type *)&local_c8);
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = PKCS12CreateVector(&local_c8,local_40._M_head_impl,&local_b0);
        local_110[0] = bVar2;
        local_108 = (EVP_PKEY_ASN1_METHOD *)0x0;
        if (bVar2) {
          local_88._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               BIO_new_mem_buf(local_c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (int)local_c8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                               (int)local_c8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          local_110[0] = (BIO *)local_88._M_head_impl != (BIO *)0x0;
          local_108 = (EVP_PKEY_ASN1_METHOD *)0x0;
          if ((BIO *)local_88._M_head_impl == (BIO *)0x0) {
            testing::Message::Message((Message *)&local_d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_100,(internal *)local_110,(AssertionResult *)0x596543,"false"
                       ,"true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x271,(char *)local_100);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_d0,(Message *)&local_d8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
            if (local_100 != (undefined1  [8])&local_f0) {
              operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
            }
            if (local_d8._M_t.super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)local_d8._M_t.
                                    super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl + 8))();
            }
            if (local_108 != (EVP_PKEY_ASN1_METHOD *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108);
            }
          }
          else {
            local_d8._M_t.super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl =
                 (tuple<pkcs12_st_*,_bssl::internal::Deleter>)
                 d2i_PKCS12_bio((BIO *)local_88._M_head_impl,(PKCS12 **)0x0);
            local_110[0] = (_Head_base<0UL,_pkcs12_st_*,_false>)
                           local_d8._M_t.
                           super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl !=
                           (_Head_base<0UL,_pkcs12_st_*,_false>)0x0;
            local_108 = (EVP_PKEY_ASN1_METHOD *)0x0;
            if ((_Head_base<0UL,_pkcs12_st_*,_false>)
                local_d8._M_t.super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_pkcs12_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&local_d0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_100,(internal *)local_110,(AssertionResult *)0x55cfa5,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x273,(char *)local_100);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_d0);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              _Var5._M_head_impl = local_d0._M_head_impl;
              if (local_100 != (undefined1  [8])&local_f0) {
                operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
                _Var5._M_head_impl = local_d0._M_head_impl;
              }
LAB_0034955d:
              if (_Var5._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)_Var5._M_head_impl + 8))();
              }
              if (local_108 != (EVP_PKEY_ASN1_METHOD *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
              }
            }
            else {
              local_d0._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_60.data_ = (AssertHelperData *)0x0;
              local_28._M_head_impl = (stack_st_X509 *)0x0;
              iVar3 = PKCS12_parse((PKCS12 *)
                                   local_d8._M_t.
                                   super__Tuple_impl<0UL,_pkcs12_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_pkcs12_st_*,_false>._M_head_impl,"foo",
                                   (EVP_PKEY **)&local_d0,(X509 **)&local_60,
                                   (stack_st_X509 **)&local_28);
              local_110[0] = iVar3 != 0;
              local_108 = (EVP_PKEY_ASN1_METHOD *)0x0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_90);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_100,(internal *)local_110,
                           (AssertionResult *)
                           "PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs)"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x279,(char *)local_100);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_98,(Message *)&local_90);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                _Var5._M_head_impl = local_90._M_head_impl;
                if (local_100 != (undefined1  [8])&local_f0) {
                  operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
                  _Var5._M_head_impl = local_90._M_head_impl;
                }
                goto LAB_0034955d;
              }
              local_90._M_head_impl = local_d0._M_head_impl;
              local_98._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)local_60.data_;
              local_30._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
                   (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
                   (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
                   local_28._M_head_impl;
              local_110 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_28._M_head_impl);
              local_e0.data_ = (AssertHelperData *)0x1;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)local_100,"sk_X509_num(ca_certs)","1UL",
                         (unsigned_long *)local_110,(unsigned_long *)&local_e0);
              if (local_100[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_110);
                if (local_f8 == (EVP_PKEY_ASN1_METHOD *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = ((_Alloc_hider *)&local_f8->pkey_id)->_M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_e0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x27e,pcVar6);
                testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_110);
LAB_003496b2:
                testing::internal::AssertHelper::~AssertHelper(&local_e0);
                if (local_110 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_110 + 8))();
                }
LAB_003496cc:
                if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_f8;
                  pEVar4 = local_f8;
LAB_003496db:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pEVar4);
                }
              }
              else {
                if (local_f8 != (EVP_PKEY_ASN1_METHOD *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
                }
                local_58._12_4_ = 0;
                x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_28._M_head_impl,0);
                pEVar4 = (EVP_PKEY_ASN1_METHOD *)X509_alias_get0(x,(int *)(local_58 + 0xc));
                local_110[0] = pEVar4 != (EVP_PKEY_ASN1_METHOD *)0x0;
                local_108 = (EVP_PKEY_ASN1_METHOD *)0x0;
                if (pEVar4 != (EVP_PKEY_ASN1_METHOD *)0x0) {
                  local_110 = (undefined1  [8])(long)(int)local_58._12_4_;
                  local_108 = pEVar4;
                  testing::internal::
                  CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                            ((internal *)local_100,"alias",
                             "bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len))",
                             &local_80,(basic_string_view<char,_std::char_traits<char>_> *)local_110
                            );
                  if (local_100[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_110);
                    if (local_f8 == (EVP_PKEY_ASN1_METHOD *)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = ((_Alloc_hider *)&local_f8->pkey_id)->_M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_e0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x285,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_110);
                    goto LAB_003496b2;
                  }
                  goto LAB_003496cc;
                }
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_108;
                testing::Message::Message((Message *)&local_e0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_100,(internal *)local_110,
                           (AssertionResult *)"parsed_alias","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x283,(char *)local_100);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_e0);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                if (local_100 != (undefined1  [8])&local_f0) {
                  operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
                }
                if (local_e0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_e0.data_ + 8))();
                }
                pEVar4 = local_108;
                if (local_108 != (EVP_PKEY_ASN1_METHOD *)0x0) goto LAB_003496db;
              }
              std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_30);
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_98);
              std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_90);
            }
            std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&local_d8);
          }
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_88);
        }
        else {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_100,(internal *)local_110,
                     (AssertionResult *)"PKCS12CreateVector(&der, key.get(), certs)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x26e,(char *)local_100);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_88)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
          if (local_100 != (undefined1  [8])&local_f0) {
            operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
          }
          if ((BIO *)local_88._M_head_impl != (BIO *)0x0) {
            (**(code **)(*(long *)local_88._M_head_impl + 8))();
          }
          if (local_108 != (EVP_PKEY_ASN1_METHOD *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          }
        }
        if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar1 = (void *)CONCAT44(local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_b0.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_b0.
                                       super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_58 + 0x10));
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_58);
LAB_00349783:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(PKCS12Test, CreateWithAlias) {
  bssl::UniquePtr<EVP_PKEY> key = MakeTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key.get());
  ASSERT_TRUE(cert2);

  std::string alias = "I'm an alias";
  int res = X509_alias_set1(
      cert1.get(), reinterpret_cast<const unsigned char *>(alias.data()),
      alias.size());
  ASSERT_EQ(res, 1);

  std::vector<X509 *> certs = {cert1.get(), cert2.get()};
  std::vector<uint8_t> der;
  ASSERT_TRUE(PKCS12CreateVector(&der, key.get(), certs));

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(der.data(), der.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  EVP_PKEY *parsed_key = nullptr;
  X509 *parsed_cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(
      PKCS12_parse(p12.get(), kPassword, &parsed_key, &parsed_cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(parsed_key);
  bssl::UniquePtr<X509> delete_cert(parsed_cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);
  ASSERT_EQ(sk_X509_num(ca_certs), 1UL);

  int alias_len = 0;
  const unsigned char *parsed_alias =
      X509_alias_get0(sk_X509_value(ca_certs, 0), &alias_len);
  ASSERT_TRUE(parsed_alias);
  ASSERT_EQ(alias,
            bssl::BytesAsStringView(bssl::Span(parsed_alias, alias_len)));
}